

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void FT_Get_Transform(FT_Face face,FT_Matrix *matrix,FT_Vector *delta)

{
  FT_Face_Internal pFVar1;
  FT_Fixed FVar2;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  FT_Pos FVar5;
  
  if (face != (FT_Face)0x0) {
    pFVar1 = face->internal;
    if (matrix != (FT_Matrix *)0x0) {
      FVar2 = (pFVar1->transform_matrix).xx;
      FVar3 = (pFVar1->transform_matrix).xy;
      FVar4 = (pFVar1->transform_matrix).yy;
      matrix->yx = (pFVar1->transform_matrix).yx;
      matrix->yy = FVar4;
      matrix->xx = FVar2;
      matrix->xy = FVar3;
    }
    if (delta != (FT_Vector *)0x0) {
      FVar5 = (pFVar1->transform_delta).y;
      delta->x = (pFVar1->transform_delta).x;
      delta->y = FVar5;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Get_Transform( FT_Face     face,
                    FT_Matrix*  matrix,
                    FT_Vector*  delta )
  {
    FT_Face_Internal  internal;


    if ( !face )
      return;

    internal = face->internal;

    if ( matrix )
      *matrix = internal->transform_matrix;

    if ( delta )
      *delta = internal->transform_delta;
  }